

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

int namingConventions::namingConventionsVariables
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  AST *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pointer pbVar5;
  uint uVar6;
  string *oldName;
  string *name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newVarNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allVarNames;
  vector<AST_*,_std::allocator<AST_*>_> vars;
  vector<Pda_*,_std::allocator<Pda_*>_> varPdas;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  allVarNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allVarNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allVarNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pbVar1 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (inputFiles->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (AST *)operator_new(8);
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
    AST::AST(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"vbn/NamingConvTests/outputs/yeeters.dot",
               (allocator<char> *)&name);
    AST::toDot(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"variable",(allocator<char> *)&name);
    AST::find(&vars,this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    for (uVar6 = 0;
        pbVar2 = newVarNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        name_00 = newVarNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (ulong)uVar6 <
        (ulong)((long)vars.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vars.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
      AST::yield_abi_cxx11_
                (&name,vars.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6]);
      iVar4 = isalpha((int)*name._M_dataplus._M_p);
      if ((((iVar4 != 0) && (bVar3 = std::operator==(&name,"true"), !bVar3)) &&
          (bVar3 = std::operator==(&name,"false"), !bVar3)) &&
         (bVar3 = findNameInVector(&allVarNames,&name), !bVar3)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&allVarNames,&name);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&newVarNames,&name);
      }
      std::__cxx11::string::~string((string *)&name);
    }
    for (; name_00 != pbVar2; name_00 = name_00 + 1) {
      name._M_dataplus._M_p = (pointer)makeNamePda(name_00);
      std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                ((vector<Pda*,std::allocator<Pda*>> *)&varPdas,(Pda **)&name);
    }
    std::_Vector_base<AST_*,_std::allocator<AST_*>_>::~_Vector_base
              (&vars.super__Vector_base<AST_*,_std::allocator<AST_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&newVarNames);
  }
  adjustForAllFiles(inputFiles,&allVarNames,&varPdas,false);
  std::_Vector_base<Pda_*,_std::allocator<Pda_*>_>::~_Vector_base
            (&varPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allVarNames);
  return 0;
}

Assistant:

int namingConventions::namingConventionsVariables(const std::vector<std::string> &inputFiles) {

    std::vector<std::string> allVarNames;
    std::vector<Pda *> varPdas;

    // bepaalt via ast alle nieuwe varNames
    for (const std::string &input: inputFiles) {

        std::vector<std::string> newVarNames;

        AST *ast = new AST(input);
        ast->toDot("vbn/NamingConvTests/outputs/yeeters.dot");
        std::vector<AST *> vars = ast->find("variable"); // all found var types

        //update de allVarTypes met de nieuwe var types
        for (unsigned int i = 0; i < vars.size(); ++i) {
            std::string name = vars[i]->yield();
            if(isalpha(name[0])){
              if (!(name == "true" || name == "false") && !findNameInVector(allVarNames, name)) {
                allVarNames.push_back(name);
                newVarNames.push_back(name);
              }
            }

        }

      for (std::string &oldName: newVarNames) {
            varPdas.emplace_back(makeNamePda(oldName));
        }
    }

    // verbetert in alle files de functieNames
    adjustForAllFiles(inputFiles, allVarNames, varPdas, false);

    return 0;
}